

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetEscapedValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  bool bVar17;
  TemplateString local_4d0;
  TemplateString local_4b0;
  TemplateString local_490;
  TemplateString local_470;
  TemplateString local_450;
  TemplateString local_430;
  TemplateString local_410;
  TemplateString local_3f0;
  TemplateString local_3d0;
  TemplateString local_3b0;
  TemplateString local_390;
  TemplateString local_370;
  DoubleEscaper local_350;
  TemplateString local_348;
  TemplateString local_328;
  TemplateString local_308;
  TemplateString local_2e8;
  DoubleEscaper local_2c8;
  DoubleEscaper double_escaper;
  size_t sStack_2b8;
  undefined8 local_2b0;
  TemplateId TStack_2a8;
  TemplateString local_2a0;
  FooEscaper local_280;
  TemplateString local_278;
  TemplateString local_258;
  FooEscaper local_238;
  FooEscaper foo_escaper;
  TemplateString local_210;
  TemplateString local_1f0;
  TemplateString local_1d0;
  TemplateString local_1b0;
  TemplateString local_190;
  TemplateString local_170;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"test_SetEscapedValue");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString(&local_d0,"hardest HTML");
  ctemplate::TemplateString::TemplateString(&local_f0,"<A HREF=\'foo\'\nid=\"bar\t\t&&\vbaz\">");
  TVar1.length_ = local_d0.length_;
  TVar1.ptr_ = local_d0.ptr_;
  TVar1.is_immutable_ = local_d0.is_immutable_;
  TVar1._17_7_ = local_d0._17_7_;
  TVar1.id_ = local_d0.id_;
  TVar9.length_ = local_f0.length_;
  TVar9.ptr_ = local_f0.ptr_;
  TVar9.is_immutable_ = local_f0.is_immutable_;
  TVar9._17_7_ = local_f0._17_7_;
  TVar9.id_ = local_f0.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar9,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_110,"hardest JS");
  ctemplate::TemplateString::TemplateString
            (&local_130,"f = \'foo\';\r\n\tprint \"\\&foo = \b\", \"foo\"");
  TVar2.length_ = local_110.length_;
  TVar2.ptr_ = local_110.ptr_;
  TVar2.is_immutable_ = local_110.is_immutable_;
  TVar2._17_7_ = local_110._17_7_;
  TVar2.id_ = local_110.id_;
  TVar10.length_ = local_130.length_;
  TVar10.ptr_ = local_130.ptr_;
  TVar10.is_immutable_ = local_130.is_immutable_;
  TVar10._17_7_ = local_130._17_7_;
  TVar10.id_ = local_130.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar10,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_150,"query escape 0");
  ctemplate::TemplateString::TemplateString(&local_170,"");
  TVar3.length_ = local_150.length_;
  TVar3.ptr_ = local_150.ptr_;
  TVar3.is_immutable_ = local_150.is_immutable_;
  TVar3._17_7_ = local_150._17_7_;
  TVar3.id_ = local_150.id_;
  TVar11.length_ = local_170.length_;
  TVar11.ptr_ = local_170.ptr_;
  TVar11.is_immutable_ = local_170.is_immutable_;
  TVar11._17_7_ = local_170._17_7_;
  TVar11.id_ = local_170.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar11,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_190,"hardest HTML");
  ctemplate::TemplateString::TemplateString
            (&local_1b0,"&lt;A HREF=&#39;foo&#39; id=&quot;bar  &amp;&amp; baz&quot;&gt;");
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_190,&local_1b0);
  if (((bVar17 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "peer.ValueIs(\"hardest HTML\", \"&lt;A HREF=&#39;foo&#39; id=&quot;bar  &amp;&amp; \" \"baz&quot;&gt;\")"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_1d0,"hardest JS");
  ctemplate::TemplateString::TemplateString
            (&local_1f0,
             "f \\x3d \\x27foo\\x27;\\r\\n\\tprint \\x22\\\\\\x26foo \\x3d \\b\\x22, \\x22foo\\x22")
  ;
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_1d0,&local_1f0);
  if (((bVar17 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "peer.ValueIs(\"hardest JS\", \"f \\\\x3d \\\\x27foo\\\\x27;\\\\r\\\\n\\\\tprint \\\\x22\\\\\\\\\\\\x26\" \"foo \\\\x3d \\\\b\\\\x22, \\\\x22foo\\\\x22\")"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_210,"query escape 0");
  ctemplate::TemplateString::TemplateString((TemplateString *)&foo_escaper,"");
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs
                     (&local_a0,&local_210,(TemplateString *)&foo_escaper);
  if (((bVar17 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"query escape 0\", \"\")");
    exit(1);
  }
  FooEscaper::FooEscaper(&local_238);
  ctemplate::TemplateString::TemplateString(&local_258,"easy foo");
  ctemplate::TemplateString::TemplateString(&local_278,"hello there!");
  local_280 = (FooEscaper)0x0;
  FooEscaper::FooEscaper(&local_280);
  TVar4.length_ = local_258.length_;
  TVar4.ptr_ = local_258.ptr_;
  TVar4.is_immutable_ = local_258.is_immutable_;
  TVar4._17_7_ = local_258._17_7_;
  TVar4.id_ = local_258.id_;
  TVar12.length_ = local_278.length_;
  TVar12.ptr_ = local_278.ptr_;
  TVar12.is_immutable_ = local_278.is_immutable_;
  TVar12._17_7_ = local_278._17_7_;
  TVar12.id_ = local_278.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar12,(TemplateModifier *)local_78);
  FooEscaper::~FooEscaper(&local_280);
  ctemplate::TemplateString::TemplateString(&local_2a0,"harder foo");
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&double_escaper,"so much to say\nso many foos");
  TVar5.length_ = local_2a0.length_;
  TVar5.ptr_ = local_2a0.ptr_;
  TVar5.is_immutable_ = local_2a0.is_immutable_;
  TVar5._17_7_ = local_2a0._17_7_;
  TVar5.id_ = local_2a0.id_;
  TVar13.length_ = sStack_2b8;
  TVar13.ptr_ = (char *)double_escaper;
  TVar13._16_8_ = local_2b0;
  TVar13.id_ = TStack_2a8;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar13,(TemplateModifier *)local_78);
  DoubleEscaper::DoubleEscaper(&local_2c8);
  ctemplate::TemplateString::TemplateString(&local_2e8,"easy double");
  ctemplate::TemplateString::TemplateString(&local_308,"doo");
  TVar6.length_ = local_2e8.length_;
  TVar6.ptr_ = local_2e8.ptr_;
  TVar6.is_immutable_ = local_2e8.is_immutable_;
  TVar6._17_7_ = local_2e8._17_7_;
  TVar6.id_ = local_2e8.id_;
  TVar14.length_ = local_308.length_;
  TVar14.ptr_ = local_308.ptr_;
  TVar14.is_immutable_ = local_308.is_immutable_;
  TVar14._17_7_ = local_308._17_7_;
  TVar14.id_ = local_308.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar14,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_328,"harder double");
  ctemplate::TemplateString::TemplateString(&local_348,"<A HREF=\'foo\'>\n");
  local_350 = (DoubleEscaper)0x0;
  DoubleEscaper::DoubleEscaper(&local_350);
  TVar7.length_ = local_328.length_;
  TVar7.ptr_ = local_328.ptr_;
  TVar7.is_immutable_ = local_328.is_immutable_;
  TVar7._17_7_ = local_328._17_7_;
  TVar7.id_ = local_328.id_;
  TVar15.length_ = local_348.length_;
  TVar15.ptr_ = local_348.ptr_;
  TVar15.is_immutable_ = local_348.is_immutable_;
  TVar15._17_7_ = local_348._17_7_;
  TVar15.id_ = local_348.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar15,(TemplateModifier *)local_78);
  DoubleEscaper::~DoubleEscaper(&local_350);
  ctemplate::TemplateString::TemplateString(&local_370,"hardest double");
  ctemplate::TemplateString::TemplateString(&local_390,"print \"<A HREF=\'foo\'>\";\r\n\\1;");
  TVar8.length_ = local_370.length_;
  TVar8.ptr_ = local_370.ptr_;
  TVar8.is_immutable_ = local_370.is_immutable_;
  TVar8._17_7_ = local_370._17_7_;
  TVar8.id_ = local_370.id_;
  TVar16.length_ = local_390.length_;
  TVar16.ptr_ = local_390.ptr_;
  TVar16.is_immutable_ = local_390.is_immutable_;
  TVar16._17_7_ = local_390._17_7_;
  TVar16.id_ = local_390.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar8,TVar16,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_3b0,"easy foo");
  ctemplate::TemplateString::TemplateString(&local_3d0,"foo");
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_3b0,&local_3d0);
  if (((bVar17 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"easy foo\", \"foo\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_3f0,"harder foo");
  ctemplate::TemplateString::TemplateString(&local_410,"foo");
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_3f0,&local_410);
  if (((bVar17 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"harder foo\", \"foo\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_430,"easy double");
  ctemplate::TemplateString::TemplateString(&local_450,"doo");
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_430,&local_450);
  if (((bVar17 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"easy double\", \"doo\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_470,"harder double");
  ctemplate::TemplateString::TemplateString(&local_490,"\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\n");
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_470,&local_490);
  if (((bVar17 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "peer.ValueIs(\"harder double\", \"\\\\x3cA HREF\\\\x3d\\\\x27foo\\\\x27\\\\x3e\\\\n\")"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_4b0,"hardest double");
  ctemplate::TemplateString::TemplateString
            (&local_4d0,"print \\x22\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\x22;\\r\\n\\\\1;");
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_4b0,&local_4d0);
  if (((bVar17 ^ 0xffU) & 1) == 0) {
    DoubleEscaper::~DoubleEscaper(&local_2c8);
    FooEscaper::~FooEscaper(&local_238);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n",
          "peer.ValueIs(\"hardest double\", \"print \\\\x22\\\\x3cA HREF\\\\x3d\\\\x27foo\\\\x27\\\\x3e\\\\x22;\" \"\\\\r\\\\n\\\\\\\\1;\")"
         );
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetEscapedValue) {
  TemplateDictionary dict("test_SetEscapedValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetEscapedValue("hardest HTML",
                       "<A HREF='foo'\nid=\"bar\t\t&&\vbaz\">",
                       GOOGLE_NAMESPACE::html_escape);
  dict.SetEscapedValue("hardest JS",
                       ("f = 'foo';\r\n\tprint \"\\&foo = \b\", \"foo\""),
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("query escape 0", "",
                       GOOGLE_NAMESPACE::url_query_escape);

  EXPECT_TRUE(peer.ValueIs("hardest HTML",
                           "&lt;A HREF=&#39;foo&#39; id=&quot;bar  &amp;&amp; "
                           "baz&quot;&gt;"));
  EXPECT_TRUE(peer.ValueIs("hardest JS",
                           "f \\x3d \\x27foo\\x27;\\r\\n\\tprint \\x22\\\\\\x26"
                           "foo \\x3d \\b\\x22, \\x22foo\\x22"));
  EXPECT_TRUE(peer.ValueIs("query escape 0", ""));

  // Test using hand-made modifiers.
  FooEscaper foo_escaper;
  dict.SetEscapedValue("easy foo", "hello there!",
                       FooEscaper());
  dict.SetEscapedValue("harder foo", "so much to say\nso many foos",
                       foo_escaper);
  DoubleEscaper double_escaper;
  dict.SetEscapedValue("easy double", "doo",
                       double_escaper);
  dict.SetEscapedValue("harder double", "<A HREF='foo'>\n",
                       DoubleEscaper());
  dict.SetEscapedValue("hardest double",
                       "print \"<A HREF='foo'>\";\r\n\\1;",
                       double_escaper);

  EXPECT_TRUE(peer.ValueIs("easy foo", "foo"));
  EXPECT_TRUE(peer.ValueIs("harder foo", "foo"));
  EXPECT_TRUE(peer.ValueIs("easy double", "doo"));
  EXPECT_TRUE(peer.ValueIs("harder double",
                           "\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\n"));
  EXPECT_TRUE(peer.ValueIs("hardest double",
                           "print \\x22\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\x22;"
                           "\\r\\n\\\\1;"));
}